

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_dec.c
# Opt level: O0

void VP8ParseQuant(VP8Decoder *dec)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  undefined8 *puVar7;
  uint *puVar8;
  long in_RDI;
  VP8QuantMatrix *m;
  int q;
  int i;
  VP8SegmentHeader *hdr;
  int dquv_ac;
  int dquv_dc;
  int dqy2_ac;
  int dqy2_dc;
  int dqy1_dc;
  int base_q0;
  VP8BitReader *br;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar9;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  uint32_t local_38;
  int local_34;
  
  uVar1 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  uVar2 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  if (uVar2 == 0) {
    local_44 = 0;
  }
  else {
    local_44 = VP8GetSignedValue((VP8BitReader *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 in_stack_ffffffffffffffac);
  }
  uVar2 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  if (uVar2 == 0) {
    local_48 = 0;
  }
  else {
    local_48 = VP8GetSignedValue((VP8BitReader *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 in_stack_ffffffffffffffac);
  }
  uVar2 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  if (uVar2 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = VP8GetSignedValue((VP8BitReader *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac);
  }
  iVar6 = iVar3;
  uVar2 = VP8GetValue((VP8BitReader *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  if (uVar2 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = VP8GetSignedValue((VP8BitReader *)CONCAT44(iVar6,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac);
  }
  iVar9 = iVar4;
  uVar2 = VP8GetValue((VP8BitReader *)CONCAT44(iVar6,iVar4),in_stack_ffffffffffffffac);
  if (uVar2 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = VP8GetSignedValue((VP8BitReader *)CONCAT44(iVar6,iVar9),in_stack_ffffffffffffffac);
  }
  local_34 = 0;
  do {
    if (3 < local_34) {
      return;
    }
    if (*(int *)(in_RDI + 0x84) == 0) {
      local_38 = uVar1;
      if (local_34 < 1) goto LAB_0015dfed;
      puVar7 = (undefined8 *)(in_RDI + 0x424 + (long)local_34 * 0x20);
      *puVar7 = *(undefined8 *)(in_RDI + 0x424);
      puVar7[1] = *(undefined8 *)(in_RDI + 0x42c);
      puVar7[2] = *(undefined8 *)(in_RDI + 0x434);
      puVar7[3] = *(undefined8 *)(in_RDI + 0x43c);
    }
    else {
      local_38 = (uint32_t)*(char *)(in_RDI + 0x90 + (long)local_34);
      if (*(int *)(in_RDI + 0x8c) == 0) {
        local_38 = uVar1 + local_38;
      }
LAB_0015dfed:
      puVar8 = (uint *)(in_RDI + 0x424 + (long)local_34 * 0x20);
      iVar6 = clip(local_38 + local_44,0x7f);
      *puVar8 = (uint)kDcTable[iVar6];
      iVar6 = clip(local_38,0x7f);
      puVar8[1] = (uint)kAcTable[iVar6];
      iVar6 = clip(local_38 + local_48,0x7f);
      puVar8[2] = (uint)kDcTable[iVar6] << 1;
      iVar6 = clip(local_38 + iVar3,0x7f);
      puVar8[3] = (int)((uint)kAcTable[iVar6] * 0x18ccd) >> 0x10;
      if ((int)puVar8[3] < 8) {
        puVar8[3] = 8;
      }
      iVar6 = clip(local_38 + iVar4,0x75);
      puVar8[4] = (uint)kDcTable[iVar6];
      iVar6 = clip(local_38 + iVar5,0x7f);
      puVar8[5] = (uint)kAcTable[iVar6];
      puVar8[6] = local_38 + iVar5;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void VP8ParseQuant(VP8Decoder* const dec) {
  VP8BitReader* const br = &dec->br;
  const int base_q0 = VP8GetValue(br, 7, "global-header");
  const int dqy1_dc = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dqy2_dc = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dqy2_ac = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dquv_dc = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;
  const int dquv_ac = VP8Get(br, "global-header") ?
       VP8GetSignedValue(br, 4, "global-header") : 0;

  const VP8SegmentHeader* const hdr = &dec->segment_hdr;
  int i;

  for (i = 0; i < NUM_MB_SEGMENTS; ++i) {
    int q;
    if (hdr->use_segment) {
      q = hdr->quantizer[i];
      if (!hdr->absolute_delta) {
        q += base_q0;
      }
    } else {
      if (i > 0) {
        dec->dqm[i] = dec->dqm[0];
        continue;
      } else {
        q = base_q0;
      }
    }
    {
      VP8QuantMatrix* const m = &dec->dqm[i];
      m->y1_mat[0] = kDcTable[clip(q + dqy1_dc, 127)];
      m->y1_mat[1] = kAcTable[clip(q + 0,       127)];

      m->y2_mat[0] = kDcTable[clip(q + dqy2_dc, 127)] * 2;
      // For all x in [0..284], x*155/100 is bitwise equal to (x*101581) >> 16.
      // The smallest precision for that is '(x*6349) >> 12' but 16 is a good
      // word size.
      m->y2_mat[1] = (kAcTable[clip(q + dqy2_ac, 127)] * 101581) >> 16;
      if (m->y2_mat[1] < 8) m->y2_mat[1] = 8;

      m->uv_mat[0] = kDcTable[clip(q + dquv_dc, 117)];
      m->uv_mat[1] = kAcTable[clip(q + dquv_ac, 127)];

      m->uv_quant = q + dquv_ac;   // for dithering strength evaluation
    }
  }
}